

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O2

uint __thiscall
pktalloc::CustomBitSet<64U>::RangePopcount(CustomBitSet<64U> *this,uint bitStart,uint bitEnd)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = 0;
  if (bitStart < bitEnd) {
    uVar3 = (ulong)(bitStart >> 6);
    uVar2 = this[uVar3].Words[0] >> ((ulong)bitStart & 0x3f);
    if (bitEnd >> 6 == bitStart >> 6) {
      uVar1 = (uint)POPCOUNT(uVar2 << ((ulong)(bitStart - bitEnd) & 0x3f));
    }
    else {
      uVar2 = POPCOUNT(uVar2);
      uVar4 = ((bitStart & 0xffffffc0) - bitEnd) + 0x80;
      while( true ) {
        uVar3 = uVar3 + 1;
        uVar1 = (uint)uVar2;
        if (bitEnd >> 6 <= uVar3) break;
        uVar4 = uVar4 + 0x40;
        uVar2 = (ulong)(uVar1 + (int)POPCOUNT(this[uVar3].Words[0]));
      }
      if (uVar4 != 0x40) {
        return uVar1 + (int)POPCOUNT(this[uVar3].Words[0] << ((ulong)uVar4 & 0x3f));
      }
    }
  }
  return uVar1;
}

Assistant:

unsigned RangePopcount(unsigned bitStart, unsigned bitEnd)
    {
        static_assert(kWordBits == 64, "Update this");

        if (bitStart >= bitEnd) {
            return 0;
        }

        unsigned wordIndex = bitStart / kWordBits;
        const unsigned wordEnd = bitEnd / kWordBits;

        // Eliminate low bits of first word
        WordT word = Words[wordIndex] >> (bitStart % kWordBits);

        // Eliminate high bits of last word if there is just one word
        if (wordEnd == wordIndex) {
            return PopCount64(word << (kWordBits - (bitEnd - bitStart)));
        }

        // Count remainder of first word
        unsigned count = PopCount64(word);

        // Accumulate popcount of full words
        while (++wordIndex < wordEnd) {
            count += PopCount64(Words[wordIndex]);
        }

        // Eliminate high bits of last word if there is one
        const unsigned lastWordBits = bitEnd - wordIndex * kWordBits;
        if (lastWordBits > 0) {
            count += PopCount64(Words[wordIndex] << (kWordBits - lastWordBits));
        }

        return count;
    }